

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void StartNetwork(bool autoPort)

{
  u_short port;
  undefined8 local_18;
  u_long trueval;
  bool autoPort_local;
  
  local_18 = 1;
  trueval._7_1_ = autoPort;
  addterm(CloseNetwork,"CloseNetwork");
  netgame = true;
  multiplayer = true;
  mysocket = UDPsocket();
  port = DOOMPORT;
  if ((trueval._7_1_ & 1) != 0) {
    port = 0;
  }
  BindToLocalPort(mysocket,port);
  ioctl(mysocket,0x5421,&local_18);
  return;
}

Assistant:

void StartNetwork (bool autoPort)
{
	u_long trueval = 1;
#ifdef __WIN32__
	WSADATA wsad;

	if (WSAStartup (0x0101, &wsad))
	{
		I_FatalError ("Could not initialize Windows Sockets");
	}
#endif

	atterm (CloseNetwork);

	netgame = true;
	multiplayer = true;
	
	// create communication socket
	mysocket = UDPsocket ();
	BindToLocalPort (mysocket, autoPort ? 0 : DOOMPORT);
#ifndef __sun
	ioctlsocket (mysocket, FIONBIO, &trueval);
#else
	fcntl(mysocket, F_SETFL, trueval | O_NONBLOCK);
#endif
}